

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

string * __thiscall
cmCoreTryCompile::LookupStdVar
          (string *__return_storage_ptr__,cmCoreTryCompile *this,string *var,bool warnCMP0067)

{
  string *psVar1;
  ulong uVar2;
  bool warnCMP0067_local;
  string *var_local;
  cmCoreTryCompile *this_local;
  string *value;
  
  psVar1 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,var);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  if ((warnCMP0067) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::__cxx11::string::clear();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->WarnCMP0067,var);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCoreTryCompile::LookupStdVar(std::string const& var,
                                           bool warnCMP0067)
{
  std::string value = this->Makefile->GetSafeDefinition(var);
  if (warnCMP0067 && !value.empty()) {
    value.clear();
    this->WarnCMP0067.push_back(var);
  }
  return value;
}